

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelUri.cpp
# Opt level: O1

ChannelUri * aeron::archive::ChannelUri::parse(ChannelUri *__return_storage_ptr__,string *str)

{
  char cVar1;
  size_t sVar2;
  ChannelUri *this;
  int iVar3;
  mapped_type *pmVar4;
  long *plVar5;
  SourcedException *pSVar6;
  char *pcVar7;
  __buckets_ptr pp_Var8;
  char cVar9;
  ulong uVar10;
  string buffer;
  string key;
  string media;
  string prefix;
  ParamsMap params;
  allocator local_171;
  string local_170;
  key_type local_150;
  mapped_type local_130;
  ChannelUri *local_110;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  undefined1 local_88 [32];
  float local_68;
  size_t local_60;
  __node_base_ptr p_Stack_58;
  string local_50;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  if (str->_M_string_length < DAT_0015f5e8) {
LAB_00123b67:
    uVar10 = 0;
  }
  else {
    if (DAT_0015f5e8 != 0) {
      iVar3 = bcmp((anonymous_namespace)::SPY_PREFIX_abi_cxx11_,(str->_M_dataplus)._M_p,DAT_0015f5e8
                  );
      if (iVar3 != 0) goto LAB_00123b67;
    }
    std::__cxx11::string::_M_assign((string *)&local_a8);
    uVar10 = DAT_0015f5e8;
  }
  sVar2 = DAT_0015f648;
  if (DAT_0015f648 + (long)(int)uVar10 <= str->_M_string_length) {
    if (DAT_0015f648 != 0) {
      iVar3 = bcmp((anonymous_namespace)::AERON_PREFIX_abi_cxx11_,
                   (str->_M_dataplus)._M_p + (int)uVar10,DAT_0015f648);
      if (iVar3 != 0) goto LAB_00123edc;
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    iVar3 = 0;
    local_130._M_string_length = 0;
    local_130.field_2._M_local_buf[0] = '\0';
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    local_150._M_string_length = 0;
    local_150.field_2._M_local_buf[0] = '\0';
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    local_170._M_string_length = 0;
    local_170.field_2._M_local_buf[0] = '\0';
    local_110 = __return_storage_ptr__;
    std::__cxx11::string::reserve((ulong)&local_170);
    uVar10 = sVar2 + uVar10;
    local_88._0_8_ = &p_Stack_58;
    local_88._8_8_ = 1;
    local_88._16_8_ = (_Hash_node_base *)0x0;
    local_88._24_8_ = 0;
    local_68 = 1.0;
    local_60 = 0;
    p_Stack_58 = (__node_base_ptr)0x0;
    if (uVar10 < str->_M_string_length) {
      iVar3 = 0;
      do {
        cVar1 = (str->_M_dataplus)._M_p[uVar10];
        cVar9 = (char)&local_170;
        if (iVar3 == 0) {
          if (cVar1 == '?') {
            std::__cxx11::string::_M_assign((string *)&local_130);
LAB_00123cf0:
            iVar3 = 1;
LAB_00123cff:
            local_170._M_string_length = 0;
            *local_170._M_dataplus._M_p = '\0';
          }
          else {
            if (cVar1 == ':') {
              pSVar6 = (SourcedException *)__cxa_allocate_exception(0x48);
              local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_108,"encountered \':\' within media definition","");
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c8,
                         "static ChannelUri aeron::archive::ChannelUri::parse(const std::string &)",
                         "");
              pcVar7 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                         ,
                                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ChannelUri.cpp"
                                        );
              std::__cxx11::string::string((string *)&local_e8,pcVar7,(allocator *)&local_50);
              util::SourcedException::SourcedException(pSVar6,&local_108,&local_c8,&local_e8,0x91);
              *(undefined ***)pSVar6 = &PTR__SourcedException_0015e308;
              __cxa_throw(pSVar6,&util::IllegalArgumentException::typeinfo,
                          util::SourcedException::~SourcedException);
            }
            iVar3 = 0;
            std::__cxx11::string::push_back(cVar9);
          }
        }
        else if (iVar3 == 1) {
          if (cVar1 == '=') {
            std::__cxx11::string::_M_assign((string *)&local_150);
            iVar3 = 2;
            goto LAB_00123cff;
          }
          iVar3 = 1;
          std::__cxx11::string::push_back(cVar9);
        }
        else {
          if (cVar1 == '|') {
            pmVar4 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)local_88,&local_150);
            std::__cxx11::string::_M_assign((string *)pmVar4);
            goto LAB_00123cf0;
          }
          iVar3 = 2;
          std::__cxx11::string::push_back(cVar9);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < str->_M_string_length);
    }
    this = local_110;
    if (iVar3 == 0) {
      pmVar4 = &local_130;
    }
    else {
      if (iVar3 != 2) {
        pSVar6 = (SourcedException *)__cxa_allocate_exception(0x48);
        std::__cxx11::to_string(&local_c8,iVar3);
        std::operator+(&local_108,"no more input found, state=",&local_c8);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,
                   "static ChannelUri aeron::archive::ChannelUri::parse(const std::string &)","");
        pcVar7 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                   ,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ChannelUri.cpp"
                                  );
        std::__cxx11::string::string((string *)&local_50,pcVar7,&local_171);
        util::SourcedException::SourcedException(pSVar6,&local_108,&local_e8,&local_50,0xc6);
        *(undefined ***)pSVar6 = &PTR__SourcedException_0015e308;
        __cxa_throw(pSVar6,&util::IllegalArgumentException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_88,&local_150);
    }
    std::__cxx11::string::_M_assign((string *)pmVar4);
    ChannelUri(this,&local_a8,&local_130,(ParamsMap *)local_88);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,
                      CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                               local_170.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                               local_150.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                               local_130.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
    return this;
  }
LAB_00123edc:
  pSVar6 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::operator+(&local_130,"Aeron URIs must start with \'aeron:\', found: \'",str);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_88._0_8_ = *plVar5;
  pp_Var8 = (__buckets_ptr)(plVar5 + 2);
  if ((__buckets_ptr)local_88._0_8_ == pp_Var8) {
    local_88._16_8_ = *pp_Var8;
    local_88._24_8_ = plVar5[3];
    local_88._0_8_ = local_88 + 0x10;
  }
  else {
    local_88._16_8_ = *pp_Var8;
  }
  local_88._8_8_ = plVar5[1];
  *plVar5 = (long)pp_Var8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "static ChannelUri aeron::archive::ChannelUri::parse(const std::string &)","");
  pcVar7 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ChannelUri.cpp"
                            );
  std::__cxx11::string::string((string *)&local_170,pcVar7,(allocator *)&local_108);
  util::SourcedException::SourcedException(pSVar6,(string *)local_88,&local_150,&local_170,0x76);
  *(undefined ***)pSVar6 = &PTR__SourcedException_0015e308;
  __cxa_throw(pSVar6,&util::IllegalArgumentException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

ChannelUri ChannelUri::parse(const std::string& str) {
    std::size_t position = 0;
    std::string prefix;

    if (startsWith(str, SPY_PREFIX)) {
        prefix = SPY_QUALIFIER;
        position += SPY_PREFIX.size();
    }

    if (!startsWith(str, position, AERON_PREFIX)) {
        throw aeron::util::IllegalArgumentException("Aeron URIs must start with 'aeron:', found: '" + str + "'",
                                                    SOURCEINFO);
    } else {
        position += AERON_PREFIX.size();
    }

    std::string media, key;
    State state = State::MEDIA;

    std::string buffer;
    buffer.reserve(str.size());

    ParamsMap params;

    while (position < str.size()) {
        char c = str[position++];

        switch (state) {
            case State::MEDIA:
                switch (c) {
                    case '?':
                        media = buffer;
                        buffer.clear();
                        state = State::PARAMS_KEY;
                        break;

                    case ':':
                        throw aeron::util::IllegalArgumentException("encountered ':' within media definition",
                                                                    SOURCEINFO);

                    default:
                        buffer.push_back(c);
                }

                break;

            case State::PARAMS_KEY:
                switch (c) {
                    case '=':
                        key = buffer;
                        buffer.clear();
                        state = State::PARAMS_VALUE;
                        break;

                    default:
                        buffer.push_back(c);
                }

                break;

            case State::PARAMS_VALUE:
                switch (c) {
                    case '|':
                        params[key] = buffer;
                        buffer.clear();
                        state = State::PARAMS_KEY;
                        break;

                    default:
                        buffer.push_back(c);
                }

                break;

            default:
                throw aeron::util::IllegalStateException("unexpected state=" + std::to_string(static_cast<int>(state)),
                                                         SOURCEINFO);
        }
    }

    switch (state) {
        case State::MEDIA:
            media = buffer;
            break;

        case State::PARAMS_VALUE:
            params[key] = buffer;
            break;

        default:
            throw aeron::util::IllegalArgumentException(
                "no more input found, state=" + std::to_string(static_cast<int>(state)), SOURCEINFO);
    }

    return ChannelUri(prefix, media, std::move(params));
}